

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskGen.cpp
# Opt level: O1

bool CompareStringFromCat(char *track,char *searched_string,char *search_ext)

{
  int i;
  int iVar1;
  long lVar2;
  size_t __n;
  bool bVar3;
  char file_ext [4];
  char filename [9];
  uint local_1c;
  char local_18 [16];
  
  local_1c = CONCAT31(*(uint3 *)(track + 8) >> 8,(char)(short)*(uint3 *)(track + 8)) & 0xff7f7f;
  local_18[8] = 0;
  local_18[0] = '\0';
  local_18[1] = '\0';
  local_18[2] = '\0';
  local_18[3] = '\0';
  local_18[4] = '\0';
  local_18[5] = '\0';
  local_18[6] = '\0';
  local_18[7] = '\0';
  lVar2 = 0;
  do {
    if (track[lVar2] == ' ') break;
    local_18[lVar2] = track[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  iVar1 = strcasecmp(local_18,searched_string);
  if (iVar1 == 0) {
    __n = strlen(search_ext);
    iVar1 = strncasecmp((char *)&local_1c,search_ext,__n);
    bVar3 = iVar1 == 0;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool CompareStringFromCat(const char* track, const char* searched_string, const char* search_ext)
{
   // Compare string
   char file_ext[4] = {0x0};
   memcpy(file_ext, &track[8], 3);
   file_ext[0] = file_ext[0] & 0x7F;
   file_ext[1] = file_ext[1] & 0x7F;
   char filename[9] = {0};
   for (int i = 0; i < 8 && track[i] != 0x20; i++)
      filename[i] = track[i];

   return (stricmp(filename, searched_string) == 0
      && strnicmp(file_ext, search_ext, strlen(search_ext)) == 0);
}